

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

size_t qHash<QFont::Tag>(QList<QFont::Tag> *key,size_t seed)

{
  Tag *pTVar1;
  unsigned_long uVar2;
  
  pTVar1 = (key->d).ptr;
  uVar2 = std::accumulate<QList<QFont::Tag>::const_iterator,unsigned_long,QtPrivate::QHashCombine>
                    (pTVar1,pTVar1 + (key->d).size,seed);
  return uVar2;
}

Assistant:

size_t qHash(const QList<T> &key, size_t seed = 0)
    noexcept(noexcept(qHashRange(key.cbegin(), key.cend(), seed)))
{
    return qHashRange(key.cbegin(), key.cend(), seed);
}